

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O3

void __thiscall
CipherTest_SHA256WithSecretSuffix_Test::TestBody(CipherTest_SHA256WithSecretSuffix_Test *this)

{
  unsigned_long len;
  int iVar1;
  char *message;
  char *in_R9;
  ScopedTrace gtest_trace_604;
  ScopedTrace gtest_trace_598;
  ScopedTrace gtest_trace_602;
  uint8_t computed [32];
  uint8_t expected [32];
  SHA256_CTX ctx;
  uint8_t buf [256];
  ScopedTrace local_24b;
  ScopedTrace local_24a;
  ScopedTrace local_249;
  undefined1 local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  unsigned_long local_238;
  unsigned_long local_230;
  unsigned_long local_228;
  Bytes local_220;
  AssertHelper local_210;
  undefined1 local_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  AssertHelperData local_1e8;
  SHA256_CTX local_1a8;
  uchar local_138 [264];
  
  RAND_bytes(local_138,0x100);
  local_238 = 0;
  do {
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&local_24a,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x256,&local_238);
    local_228 = 0;
    do {
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&local_249,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x25a,&local_228);
      local_230 = 0;
      do {
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  (&local_24b,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x25c,&local_230);
        SHA256(local_138,local_230 + local_238,(uchar *)&local_1e8.message._M_string_length);
        len = local_230;
        SHA256_Init(&local_1a8);
        SHA256_Update(&local_1a8,local_138,local_238);
        iVar1 = EVP_sha256_final_with_secret_suffix
                          ((SHA256_CTX *)&local_1a8,(uint8_t *)&local_1e8,local_138 + local_238,len,
                           local_228);
        local_248[0] = iVar1 != 0;
        local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_220);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_208,(internal *)local_248,
                     (AssertionResult *)
                     "EVP_sha256_final_with_secret_suffix( &ctx, computed, buf + prefix, secret_len, max_len)"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_210,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x26b,(char *)CONCAT71(local_208._1_7_,local_208[0]));
          testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_220);
          testing::internal::AssertHelper::~AssertHelper(&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_208._1_7_,local_208[0]) != &local_1f8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_208._1_7_,local_208[0]),
                            local_1f8._M_allocated_capacity + 1);
          }
          if ((AssertHelperData *)local_220.span_.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_220.span_.data_ + 8))();
          }
          if (local_240 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_240,local_240);
          }
          testing::ScopedTrace::~ScopedTrace(&local_24b);
          testing::ScopedTrace::~ScopedTrace(&local_249);
          testing::ScopedTrace::~ScopedTrace(&local_24a);
          return;
        }
        local_248 = (undefined1  [8])&local_1e8.message._M_string_length;
        local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20;
        local_220.span_.data_ = (uchar *)&local_1e8;
        local_220.span_.size_ = 0x20;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_208,"Bytes(expected)","Bytes(computed)",(Bytes *)local_248,
                   &local_220);
        if (local_208[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_248);
          message = "";
          if (local_200 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = (local_200->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_220,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x26e,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_220,(Message *)local_248);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_220);
          if (local_248 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_248 + 8))();
          }
        }
        if (local_200 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_200,local_200);
        }
        testing::ScopedTrace::~ScopedTrace(&local_24b);
        local_230 = local_230 + 3;
      } while (local_230 <= local_228);
      testing::ScopedTrace::~ScopedTrace(&local_249);
      local_228 = local_228 + 3;
    } while (local_228 < 0xc0);
    testing::ScopedTrace::~ScopedTrace(&local_24a);
    local_238 = local_238 + 3;
  } while (local_238 < 0x40);
  return;
}

Assistant:

TEST(CipherTest, SHA256WithSecretSuffix) {
  uint8_t buf[SHA256_CBLOCK * 4];
  RAND_bytes(buf, sizeof(buf));
  // Hashing should run in time independent of the bytes.
  CONSTTIME_SECRET(buf, sizeof(buf));

  // Exhaustively testing interesting cases in this function is cubic in the
  // block size, so we test in 3-byte increments.
  constexpr size_t kSkip = 3;
  // This value should be less than 8 to test the edge case when the 8-byte
  // length wraps to the next block.
  static_assert(kSkip < 8, "kSkip is too large");

  // |EVP_sha256_final_with_secret_suffix| is sensitive to the public length of
  // the partial block previously hashed. In TLS, this is the HMAC prefix, the
  // header, and the public minimum padding length.
  for (size_t prefix = 0; prefix < SHA256_CBLOCK; prefix += kSkip) {
    SCOPED_TRACE(prefix);
    // The first block is treated differently, so we run with up to three
    // blocks of length variability.
    for (size_t max_len = 0; max_len < 3 * SHA256_CBLOCK; max_len += kSkip) {
      SCOPED_TRACE(max_len);
      for (size_t len = 0; len <= max_len; len += kSkip) {
        SCOPED_TRACE(len);

        uint8_t expected[SHA256_DIGEST_LENGTH];
        SHA256(buf, prefix + len, expected);
        CONSTTIME_DECLASSIFY(expected, sizeof(expected));

        // Make a copy of the secret length to avoid interfering with the loop.
        size_t secret_len = len;
        CONSTTIME_SECRET(&secret_len, sizeof(secret_len));

        SHA256_CTX ctx;
        SHA256_Init(&ctx);
        SHA256_Update(&ctx, buf, prefix);
        uint8_t computed[SHA256_DIGEST_LENGTH];
        ASSERT_TRUE(EVP_sha256_final_with_secret_suffix(
            &ctx, computed, buf + prefix, secret_len, max_len));

        CONSTTIME_DECLASSIFY(computed, sizeof(computed));
        EXPECT_EQ(Bytes(expected), Bytes(computed));
      }
    }
  }
}